

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# def_to_proto.c
# Opt level: O3

google_protobuf_FieldDescriptorProto * fielddef_toproto(upb_ToProto_Context *ctx,upb_FieldDef *f)

{
  char ch;
  byte ch_00;
  upb_Arena *puVar1;
  _Bool _Var2;
  uint32_t uVar3;
  google_protobuf_Edition gVar4;
  upb_Label uVar5;
  upb_FieldType uVar6;
  upb_DecodeStatus uVar8;
  int iVar9;
  char *pcVar10;
  size_t sVar11;
  upb_FileDef *puVar12;
  upb_MessageDef *puVar13;
  upb_EnumDef *puVar14;
  upb_CType uVar7;
  upb_OneofDef *o;
  google_protobuf_FieldOptions *msg;
  long lVar15;
  upb_EnumValueDef *v;
  google_protobuf_FieldDescriptorProto *__s;
  anon_union_8_2_9eb4e620_for_upb_Message_0 msg_00;
  byte *pbVar16;
  size_t sVar17;
  size_t sVar18;
  byte *pbVar19;
  ulong size_00;
  float num;
  size_t sVar20;
  upb_Map *puVar21;
  upb_Map *puVar22;
  upb_StringView str;
  upb_StringView uVar23;
  upb_MessageValue str_00;
  upb_StringView uVar24;
  size_t size;
  char *ptr;
  size_t local_40;
  char *local_38;
  
  puVar1 = ctx->arena;
  __s = (google_protobuf_FieldDescriptorProto *)puVar1->ptr_dont_copy_me__upb_internal_use_only;
  if ((ulong)((long)puVar1->end_dont_copy_me__upb_internal_use_only - (long)__s) < 0x78) {
    __s = (google_protobuf_FieldDescriptorProto *)
          _upb_Arena_SlowMalloc_dont_copy_me__upb_internal_use_only(puVar1,0x78);
  }
  else {
    if ((google_protobuf_FieldDescriptorProto *)
        ((ulong)((long)&(__s->base_dont_copy_me__upb_internal_use_only).field_0 + 7U) &
        0xfffffffffffffff8) != __s) goto LAB_00119304;
    puVar1->ptr_dont_copy_me__upb_internal_use_only = (char *)(__s + 0xf);
  }
  if (__s == (google_protobuf_FieldDescriptorProto *)0x0) goto LAB_001192bc;
  memset(__s,0,0x78);
  pcVar10 = upb_FieldDef_Name(f);
  sVar11 = strlen(pcVar10);
  uVar23.size = sVar11;
  uVar23.data = pcVar10;
  uVar23 = strviewdup2(ctx,uVar23);
  if (((ulong)(__s->base_dont_copy_me__upb_internal_use_only).field_0 & 1) != 0) goto LAB_001192e5;
  *(byte *)&__s[1].base_dont_copy_me__upb_internal_use_only.field_0 =
       *(byte *)&__s[1].base_dont_copy_me__upb_internal_use_only.field_0 | 1;
  *(upb_StringView *)(__s + 4) = uVar23;
  uVar3 = upb_FieldDef_Number(f);
  if (((ulong)(__s->base_dont_copy_me__upb_internal_use_only).field_0 & 1) != 0) goto LAB_001192e5;
  *(byte *)&__s[1].base_dont_copy_me__upb_internal_use_only.field_0 =
       *(byte *)&__s[1].base_dont_copy_me__upb_internal_use_only.field_0 | 4;
  *(uint32_t *)((long)&__s[1].base_dont_copy_me__upb_internal_use_only.field_0 + 4) = uVar3;
  _Var2 = upb_FieldDef_IsRequired(f);
  if (_Var2) {
    puVar12 = upb_FieldDef_File(f);
    gVar4 = upb_FileDef_Edition(puVar12);
    if (gVar4 < google_protobuf_EDITION_2023) goto LAB_00118d48;
    uVar5 = kUpb_Label_Optional;
  }
  else {
LAB_00118d48:
    uVar5 = upb_FieldDef_Label(f);
  }
  if (((ulong)(__s->base_dont_copy_me__upb_internal_use_only).field_0 & 1) != 0) goto LAB_001192e5;
  *(byte *)&__s[1].base_dont_copy_me__upb_internal_use_only.field_0 =
       *(byte *)&__s[1].base_dont_copy_me__upb_internal_use_only.field_0 | 8;
  *(upb_Label *)&__s[2].base_dont_copy_me__upb_internal_use_only.field_0 = uVar5;
  uVar6 = upb_FieldDef_Type(f);
  if (uVar6 == kUpb_FieldType_Group) {
    puVar12 = upb_FieldDef_File(f);
    gVar4 = upb_FileDef_Edition(puVar12);
    if (gVar4 < google_protobuf_EDITION_2023) goto LAB_00118d8e;
    uVar6 = kUpb_FieldType_Message;
  }
  else {
LAB_00118d8e:
    uVar6 = upb_FieldDef_Type(f);
  }
  if (((ulong)(__s->base_dont_copy_me__upb_internal_use_only).field_0 & 1) != 0) goto LAB_001192e5;
  *(byte *)&__s[1].base_dont_copy_me__upb_internal_use_only.field_0 =
       *(byte *)&__s[1].base_dont_copy_me__upb_internal_use_only.field_0 | 0x10;
  *(upb_FieldType *)((long)&__s[2].base_dont_copy_me__upb_internal_use_only.field_0 + 4) = uVar6;
  _Var2 = upb_FieldDef_HasJsonName(f);
  if (_Var2) {
    pcVar10 = upb_FieldDef_JsonName(f);
    sVar11 = strlen(pcVar10);
    str.size = sVar11;
    str.data = pcVar10;
    uVar23 = strviewdup2(ctx,str);
    if (((ulong)(__s->base_dont_copy_me__upb_internal_use_only).field_0 & 1) != 0)
    goto LAB_001192e5;
    pbVar16 = (byte *)((long)&__s[1].base_dont_copy_me__upb_internal_use_only.field_0 + 1);
    *pbVar16 = *pbVar16 | 2;
    *(upb_StringView *)(__s + 0xd) = uVar23;
  }
  _Var2 = upb_FieldDef_IsSubMessage(f);
  if (_Var2) {
    puVar13 = upb_FieldDef_MessageSubDef(f);
    pcVar10 = upb_MessageDef_FullName(puVar13);
LAB_00118e25:
    uVar23 = qual_dup(ctx,pcVar10);
    if (((ulong)(__s->base_dont_copy_me__upb_internal_use_only).field_0 & 1) != 0)
    goto LAB_001192e5;
    *(byte *)&__s[1].base_dont_copy_me__upb_internal_use_only.field_0 =
         *(byte *)&__s[1].base_dont_copy_me__upb_internal_use_only.field_0 | 0x20;
    *(upb_StringView *)(__s + 8) = uVar23;
  }
  else {
    uVar7 = upb_FieldDef_CType(f);
    if (uVar7 == kUpb_CType_Enum) {
      puVar14 = upb_FieldDef_EnumSubDef(f);
      pcVar10 = upb_EnumDef_FullName(puVar14);
      goto LAB_00118e25;
    }
  }
  _Var2 = upb_FieldDef_IsExtension(f);
  if (_Var2) {
    puVar13 = upb_FieldDef_ContainingType(f);
    pcVar10 = upb_MessageDef_FullName(puVar13);
    uVar23 = qual_dup(ctx,pcVar10);
    if (((ulong)(__s->base_dont_copy_me__upb_internal_use_only).field_0 & 1) != 0)
    goto LAB_001192e5;
    *(byte *)&__s[1].base_dont_copy_me__upb_internal_use_only.field_0 =
         *(byte *)&__s[1].base_dont_copy_me__upb_internal_use_only.field_0 | 2;
    *(upb_StringView *)(__s + 6) = uVar23;
  }
  _Var2 = upb_FieldDef_HasDefault(f);
  if (!_Var2) goto LAB_00118f2a;
  str_00 = upb_FieldDef_Default(f);
  sVar17 = str_00.str_val.size;
  puVar22 = str_00.map_val;
  uVar7 = upb_FieldDef_CType(f);
  num = str_00.float_val;
  if ((uVar7 == kUpb_CType_Double) || (uVar7 == kUpb_CType_Float)) {
    puVar21 = puVar22;
    if (uVar7 == kUpb_CType_Float) {
      puVar21 = (upb_Map *)(double)num;
    }
    if ((double)puVar21 < INFINITY) {
      if (-INFINITY < (double)puVar21) {
        if (!NAN((double)puVar21)) goto LAB_00119072;
        pcVar10 = "nan";
        goto LAB_00118ee3;
      }
      pcVar10 = "-inf";
      sVar17 = 4;
    }
    else {
      pcVar10 = "inf";
LAB_00118ee3:
      sVar17 = 3;
    }
    str_00.str_val.size = sVar17;
    str_00.double_val = (double)pcVar10;
    goto LAB_00118f0b;
  }
LAB_00119072:
  uVar7 = upb_FieldDef_CType(f);
  switch(uVar7) {
  case kUpb_CType_Bool:
    pcVar10 = "false";
    if (((undefined1  [16])str_00 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      pcVar10 = "true";
    }
    str_00.str_val.size = (ulong)((uint)num & 1) ^ 5;
    str_00.str_val.data = pcVar10;
    break;
  case kUpb_CType_Float:
    puVar22 = (upb_Map *)(double)num;
    pcVar10 = "%.9g";
    goto LAB_00119243;
  case kUpb_CType_Int32:
    pcVar10 = "%d";
    goto LAB_00119268;
  case kUpb_CType_UInt32:
    pcVar10 = "%u";
LAB_00119268:
    uVar24 = printf_dup(ctx,pcVar10,(ulong)puVar22 & 0xffffffff);
    goto LAB_00118f13;
  case kUpb_CType_Enum:
    puVar14 = upb_FieldDef_EnumSubDef(f);
    v = upb_EnumDef_FindValueByNumber(puVar14,(int32_t)num);
    pcVar10 = upb_EnumValueDef_Name(v);
    sVar11 = strlen(pcVar10);
    str_00.str_val.size = sVar11;
    str_00.str_val.data = pcVar10;
    break;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/upb/util/def_to_proto.c"
                  ,0xb7,"upb_StringView default_string(upb_ToProto_Context *, const upb_FieldDef *)"
                 );
  case kUpb_CType_Double:
    pcVar10 = "%.17g";
LAB_00119243:
    uVar24 = printf_dup(ctx,pcVar10,puVar22);
    goto LAB_00118f13;
  case kUpb_CType_Int64:
    pcVar10 = "%ld";
    goto LAB_00119281;
  case kUpb_CType_UInt64:
    pcVar10 = "%lu";
LAB_00119281:
    uVar24 = printf_dup(ctx,pcVar10,puVar22);
    goto LAB_00118f13;
  case kUpb_CType_String:
    break;
  case kUpb_CType_Bytes:
    sVar20 = 0;
    if (sVar17 != 0) {
      sVar18 = 0;
      do {
        ch = (&puVar22->key_size)[sVar18];
        iVar9 = special_escape(ch);
        lVar15 = (ulong)(ch < ' ') * 3 + 1;
        if (-1 < iVar9) {
          lVar15 = 2;
        }
        sVar20 = sVar20 + lVar15;
        sVar18 = sVar18 + 1;
      } while (sVar17 != sVar18);
    }
    puVar1 = ctx->arena;
    size_00 = sVar20 + 7 & 0xfffffffffffffff8;
    pbVar16 = (byte *)puVar1->ptr_dont_copy_me__upb_internal_use_only;
    if ((ulong)((long)puVar1->end_dont_copy_me__upb_internal_use_only - (long)pbVar16) < size_00) {
      pbVar16 = (byte *)_upb_Arena_SlowMalloc_dont_copy_me__upb_internal_use_only(puVar1,size_00);
    }
    else {
      if ((byte *)((ulong)(pbVar16 + 7) & 0xfffffffffffffff8) != pbVar16) goto LAB_00119304;
      puVar1->ptr_dont_copy_me__upb_internal_use_only = (char *)(pbVar16 + size_00);
    }
    uVar24.size = sVar20;
    uVar24.data = (char *)pbVar16;
    if (pbVar16 == (byte *)0x0) goto LAB_001192bc;
    if (0 < (long)sVar17) {
      pcVar10 = &puVar22->key_size;
      pbVar19 = pbVar16;
      do {
        ch_00 = puVar22->key_size;
        iVar9 = special_escape(ch_00);
        if (iVar9 < 0) {
          if ((char)ch_00 < ' ') {
            *pbVar19 = 0x5c;
            pbVar19[1] = ch_00 >> 6 | 0x30;
            pbVar19[2] = ch_00 >> 3 & 7 | 0x30;
            pbVar19[3] = ch_00 & 7 | 0x30;
            pbVar19 = pbVar19 + 4;
          }
          else {
            *pbVar19 = ch_00;
            pbVar19 = pbVar19 + 1;
          }
        }
        else {
          *pbVar19 = 0x5c;
          pbVar19[1] = (byte)iVar9;
          pbVar19 = pbVar19 + 2;
        }
        puVar22 = (upb_Map *)&puVar22->val_size;
      } while (puVar22 < pcVar10 + sVar17);
    }
    goto LAB_00118f13;
  }
LAB_00118f0b:
  uVar24 = strviewdup2(ctx,str_00.str_val);
LAB_00118f13:
  if (((ulong)(__s->base_dont_copy_me__upb_internal_use_only).field_0 & 1) == 0) {
    *(byte *)&__s[1].base_dont_copy_me__upb_internal_use_only.field_0 =
         *(byte *)&__s[1].base_dont_copy_me__upb_internal_use_only.field_0 | 0x40;
    *(upb_StringView *)(__s + 10) = uVar24;
LAB_00118f2a:
    o = upb_FieldDef_ContainingOneof(f);
    if (o != (upb_OneofDef *)0x0) {
      uVar3 = upb_OneofDef_Index(o);
      if (((ulong)(__s->base_dont_copy_me__upb_internal_use_only).field_0 & 1) != 0)
      goto LAB_001192e5;
      pbVar16 = (byte *)((long)&__s[1].base_dont_copy_me__upb_internal_use_only.field_0 + 1);
      *pbVar16 = *pbVar16 | 1;
      *(uint32_t *)&__s[3].base_dont_copy_me__upb_internal_use_only.field_0 = uVar3;
    }
    _Var2 = _upb_FieldDef_IsProto3Optional(f);
    if (_Var2) {
      if (((ulong)(__s->base_dont_copy_me__upb_internal_use_only).field_0 & 1) != 0)
      goto LAB_001192e5;
      pbVar16 = (byte *)((long)&__s[1].base_dont_copy_me__upb_internal_use_only.field_0 + 1);
      *pbVar16 = *pbVar16 | 4;
      *(char *)((long)&__s[3].base_dont_copy_me__upb_internal_use_only.field_0 + 4) = '\x01';
    }
    _Var2 = upb_FieldDef_HasOptions(f);
    if (!_Var2) {
      return __s;
    }
    msg = upb_FieldDef_Options(f);
    upb_Encode(&msg->base_dont_copy_me__upb_internal_use_only,
               &google__protobuf__FieldOptions_msg_init,0,ctx->arena,&local_38,&local_40);
    if (local_38 != (char *)0x0) {
      puVar1 = ctx->arena;
      msg_00.internal_opaque = (uintptr_t)puVar1->ptr_dont_copy_me__upb_internal_use_only;
      if ((ulong)((long)puVar1->end_dont_copy_me__upb_internal_use_only - (long)msg_00) < 0x48) {
        msg_00 = (anon_union_8_2_9eb4e620_for_upb_Message_0)
                 _upb_Arena_SlowMalloc_dont_copy_me__upb_internal_use_only(puVar1,0x48);
      }
      else {
        if ((char *)((ulong)(msg_00.internal_opaque + 7) & 0xfffffffffffffff8) !=
            (char *)msg_00.internal_opaque) {
LAB_00119304:
          __assert_fail("((((uintptr_t)ret) + (8) - 1) / (8) * (8)) == (uintptr_t)ret",
                        "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/upb/mem/internal/arena.h"
                        ,0x3f,"void *upb_Arena_Malloc(struct upb_Arena *, size_t)");
        }
        puVar1->ptr_dont_copy_me__upb_internal_use_only = (char *)(msg_00.internal_opaque + 0x48);
      }
      if ((anon_union_8_2_9eb4e620_for_upb_Message_0)msg_00.internal_opaque !=
          (anon_union_8_2_9eb4e620_for_upb_Message_0)0x0) {
        memset((void *)msg_00,0,0x48);
        uVar8 = upb_Decode(local_38,local_40,(upb_Message *)msg_00,
                           &google__protobuf__FieldOptions_msg_init,(upb_ExtensionRegistry *)0x0,0,
                           puVar1);
        if (uVar8 == kUpb_DecodeStatus_Ok) {
          if (((ulong)(__s->base_dont_copy_me__upb_internal_use_only).field_0 & 1) == 0) {
            *(byte *)&__s[1].base_dont_copy_me__upb_internal_use_only.field_0 =
                 *(byte *)&__s[1].base_dont_copy_me__upb_internal_use_only.field_0 | 0x80;
            *(anon_union_8_2_9eb4e620_for_upb_Message_0 *)(__s + 0xc) = msg_00;
            return __s;
          }
          goto LAB_001192e5;
        }
      }
    }
LAB_001192bc:
    longjmp((__jmp_buf_tag *)ctx->err,1);
  }
LAB_001192e5:
  __assert_fail("!upb_Message_IsFrozen(msg)",
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/upb/message/internal/accessors.h"
                ,0x13b,
                "void upb_Message_SetBaseField(struct upb_Message *, const upb_MiniTableField *, const void *)"
               );
}

Assistant:

static google_protobuf_FieldDescriptorProto* fielddef_toproto(upb_ToProto_Context* ctx,
                                                     const upb_FieldDef* f) {
  google_protobuf_FieldDescriptorProto* proto =
      google_protobuf_FieldDescriptorProto_new(ctx->arena);
  CHK_OOM(proto);

  google_protobuf_FieldDescriptorProto_set_name(proto,
                                       strviewdup(ctx, upb_FieldDef_Name(f)));
  google_protobuf_FieldDescriptorProto_set_number(proto, upb_FieldDef_Number(f));

  if (upb_FieldDef_IsRequired(f) &&
      upb_FileDef_Edition(upb_FieldDef_File(f)) >= UPB_DESC(EDITION_2023)) {
    google_protobuf_FieldDescriptorProto_set_label(
        proto, UPB_DESC(FieldDescriptorProto_LABEL_OPTIONAL));
  } else {
    google_protobuf_FieldDescriptorProto_set_label(proto, upb_FieldDef_Label(f));
  }
  if (upb_FieldDef_Type(f) == kUpb_FieldType_Group &&
      upb_FileDef_Edition(upb_FieldDef_File(f)) >= UPB_DESC(EDITION_2023)) {
    google_protobuf_FieldDescriptorProto_set_type(proto, kUpb_FieldType_Message);
  } else {
    google_protobuf_FieldDescriptorProto_set_type(proto, upb_FieldDef_Type(f));
  }

  if (upb_FieldDef_HasJsonName(f)) {
    google_protobuf_FieldDescriptorProto_set_json_name(
        proto, strviewdup(ctx, upb_FieldDef_JsonName(f)));
  }

  if (upb_FieldDef_IsSubMessage(f)) {
    google_protobuf_FieldDescriptorProto_set_type_name(
        proto,
        qual_dup(ctx, upb_MessageDef_FullName(upb_FieldDef_MessageSubDef(f))));
  } else if (upb_FieldDef_CType(f) == kUpb_CType_Enum) {
    google_protobuf_FieldDescriptorProto_set_type_name(
        proto, qual_dup(ctx, upb_EnumDef_FullName(upb_FieldDef_EnumSubDef(f))));
  }

  if (upb_FieldDef_IsExtension(f)) {
    google_protobuf_FieldDescriptorProto_set_extendee(
        proto,
        qual_dup(ctx, upb_MessageDef_FullName(upb_FieldDef_ContainingType(f))));
  }

  if (upb_FieldDef_HasDefault(f)) {
    google_protobuf_FieldDescriptorProto_set_default_value(proto,
                                                  default_string(ctx, f));
  }

  const upb_OneofDef* o = upb_FieldDef_ContainingOneof(f);
  if (o) {
    google_protobuf_FieldDescriptorProto_set_oneof_index(proto, upb_OneofDef_Index(o));
  }

  if (_upb_FieldDef_IsProto3Optional(f)) {
    google_protobuf_FieldDescriptorProto_set_proto3_optional(proto, true);
  }

  if (upb_FieldDef_HasOptions(f)) {
    SET_OPTIONS(proto, FieldDescriptorProto, FieldOptions,
                upb_FieldDef_Options(f));
  }

  return proto;
}